

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

void __thiscall zsummer::log4z::CLogerManager::UpdateConfig(CLogerManager *this)

{
  UpdateConfig((CLogerManager *)&this[-1].m_ullStatusTotalPushLog);
  return;
}

Assistant:

bool UpdateConfig()
	{
		if (m_configFile.empty())
		{
			return false;
		}
		std::map<std::string, LoggerInfo> loggerMap;
		ParseConfig(m_configFile.c_str(), loggerMap);
		for (std::map<std::string, LoggerInfo>::iterator iter = loggerMap.begin(); iter != loggerMap.end(); ++iter)
		{
			LoggerId id = FindLogger(iter->first);
			if (id != LOG4Z_INVALID_LOGGER_ID)
			{
				SetLoggerDisplay(id, iter->second._display);
				SetLoggerLevel(id, iter->second._level);
				SetLoggerMonthdir(id, iter->second._monthdir);
				SetLoggerLimitSize(id, iter->second._limitsize);
			}
		}
		return true;
	}